

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

int namingConventions::namingConventionsVariables
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  AST *this;
  ulong uVar5;
  string *oldName;
  ulong uVar6;
  string *name_00;
  pointer pbVar7;
  vector<AST_*,_std::allocator<AST_*>_> vars;
  vector<Pda_*,_std::allocator<Pda_*>_> varPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allVarNames;
  string name;
  vector<AST_*,_std::allocator<AST_*>_> local_140;
  vector<Pda_*,_std::allocator<Pda_*>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  pointer local_60;
  pointer local_58;
  undefined1 local_50 [32];
  
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pbVar7 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (inputFiles->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = inputFiles;
  if (pbVar7 != local_60) {
    do {
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = (AST *)operator_new(8);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar1,pcVar1 + pbVar7->_M_string_length);
      AST::AST(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"vbn/NamingConvTests/outputs/yeeters.dot","");
      AST::toDot(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"variable","");
      AST::find(&local_140,this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      name_00 = local_108.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_108.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          AST::yield_abi_cxx11_
                    ((string *)local_50,
                     local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5]);
          iVar4 = isalpha((int)*(char *)local_50._0_8_);
          if ((((iVar4 != 0) &&
               (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 != 0)) &&
              (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 != 0)) &&
             (bVar3 = findNameInVector(&local_e8,(string *)local_50), !bVar3)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_e8,(string *)local_50);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_108,(string *)local_50);
          }
          if ((Pda *)local_50._0_8_ != (Pda *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          bVar3 = uVar6 < (ulong)((long)local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
          name_00 = local_108.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar2 = local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (bVar3);
      }
      for (; local_58 = pbVar7, name_00 != psVar2; name_00 = name_00 + 1) {
        local_50._0_8_ = makeNamePda(name_00);
        std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                  ((vector<Pda*,std::allocator<Pda*>> *)&local_128,(Pda **)local_50);
        pbVar7 = local_58;
      }
      if (local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      pbVar7 = local_58 + 1;
    } while (pbVar7 != local_60);
  }
  adjustForAllFiles(local_68,&local_e8,&local_128,false);
  if (local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return 0;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}